

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

char * __thiscall OptIstreamIter::curr(OptIstreamIter *this)

{
  return (char *)0x0;
}

Assistant:

const char *
OptIstreamIter::curr(void) {
#ifdef  USE_STDIO
   return  NULLSTR;
#else
   const char * result = NULLSTR;
   if (tok_iter)  result = tok_iter->curr();
   if (result)  return  result;
   fill();
   return (! is) ? NULLSTR : tok_iter->curr();
#endif  /* USE_STDIO */
}